

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O0

shared_ptr<Storage::Data::ZX8081::File> __thiscall
Storage::Data::ZX8081::FileFromData
          (ZX8081 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Storage::Data::ZX8081::File> sVar2;
  undefined1 local_28 [8];
  shared_ptr<Storage::Data::ZX8081::File> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  result.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
  ZX81FileFromData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
  if (bVar1) {
    std::shared_ptr<Storage::Data::ZX8081::File>::shared_ptr
              ((shared_ptr<Storage::Data::ZX8081::File> *)this,
               (shared_ptr<Storage::Data::ZX8081::File> *)local_28);
  }
  else {
    ZX80FileFromData((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  std::shared_ptr<Storage::Data::ZX8081::File>::~shared_ptr
            ((shared_ptr<Storage::Data::ZX8081::File> *)local_28);
  sVar2.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Data::ZX8081::File>)
         sVar2.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<File> Storage::Data::ZX8081::FileFromData(const std::vector<uint8_t> &data) {
	std::shared_ptr<Storage::Data::ZX8081::File> result = ZX81FileFromData(data);
	if(result) return result;
	return ZX80FileFromData(data);
}